

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall
MipsParser::parseVfpuRegister(MipsParser *this,Parser *parser,MipsRegisterValue *reg,int size)

{
  bool bVar1;
  int iVar2;
  Identifier *this_00;
  size_t sVar3;
  string *psVar4;
  char *pcVar5;
  uint local_4c;
  int mode;
  int row;
  int col;
  int mtx;
  Identifier *identifier;
  Token *token;
  MipsRegisterValue *pMStack_28;
  int size_local;
  MipsRegisterValue *reg_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  token._4_4_ = size;
  pMStack_28 = reg;
  reg_local = (MipsRegisterValue *)parser;
  parser_local = (Parser *)this;
  identifier = (Identifier *)Parser::peekToken(parser,0);
  if (((Token *)identifier)->type != Identifier) {
    return false;
  }
  this_00 = Token::identifierValue((Token *)identifier);
  sVar3 = Identifier::size(this_00);
  if (sVar3 != 4) {
    return false;
  }
  _col = Token::identifierValue((Token *)identifier);
  psVar4 = Identifier::string_abi_cxx11_(_col);
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
  bVar1 = decodeDigit(*pcVar5,&row);
  if (!bVar1) {
    return false;
  }
  psVar4 = Identifier::string_abi_cxx11_(_col);
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
  bVar1 = decodeDigit(*pcVar5,&mode);
  if (!bVar1) {
    return false;
  }
  psVar4 = Identifier::string_abi_cxx11_(_col);
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
  bVar1 = decodeDigit(*pcVar5,(int *)&local_4c);
  if (!bVar1) {
    return false;
  }
  psVar4 = Identifier::string_abi_cxx11_(_col);
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
  iVar2 = tolower((int)*pcVar5);
  if ((token._4_4_ < 0) || (3 < token._4_4_)) {
    return false;
  }
  if (((3 < (int)local_4c) || (3 < mode)) || (7 < row)) {
    return false;
  }
  pMStack_28->num = 0;
  switch(iVar2) {
  case 99:
    break;
  default:
    return false;
  case 0x65:
    pMStack_28->num = pMStack_28->num | 0x20;
  case 0x6d:
    pMStack_28->type = VfpuMatrix;
    if (token._4_4_ != 1) {
      if (token._4_4_ == 2) {
        if ((local_4c & 0xfffffffe) != 0) {
          return false;
        }
        local_4c = local_4c << 1;
        goto LAB_001cd934;
      }
      if (token._4_4_ != 3) {
        return false;
      }
    }
    if ((local_4c & 1) != 0) {
      return false;
    }
    goto LAB_001cd934;
  case 0x72:
    pMStack_28->num = pMStack_28->num | 0x20;
    std::swap<int>(&mode,(int *)&local_4c);
    break;
  case 0x73:
    pMStack_28->type = VfpuVector;
    if (token._4_4_ != 0) {
      return false;
    }
    goto LAB_001cd934;
  }
  pMStack_28->type = VfpuVector;
  if (token._4_4_ != 1) {
    if (token._4_4_ == 2) {
      if ((local_4c & 2) != 0) {
        return false;
      }
      local_4c = local_4c << 1;
      goto LAB_001cd934;
    }
    if (token._4_4_ != 3) {
      return false;
    }
  }
  if ((local_4c & 1) != 0) {
    return false;
  }
LAB_001cd934:
  pMStack_28->num = row << 2 | pMStack_28->num;
  pMStack_28->num = mode | pMStack_28->num;
  pMStack_28->num = local_4c << 5 | pMStack_28->num;
  Identifier::operator=(&pMStack_28->name,_col);
  Parser::eatToken((Parser *)reg_local);
  return true;
}

Assistant:

bool MipsParser::parseVfpuRegister(Parser& parser, MipsRegisterValue& reg, int size)
{
	const Token& token = parser.peekToken();
	if (token.type != TokenType::Identifier || token.identifierValue().size() != 4)
		return false;

	const Identifier &identifier = token.identifierValue();

	int mtx,col,row;
	if (!decodeDigit(identifier.string()[1],mtx)) return false;
	if (!decodeDigit(identifier.string()[2],col)) return false;
	if (!decodeDigit(identifier.string()[3],row)) return false;
	int mode = tolower(identifier.string()[0]);

	if (size < 0 || size > 3)
		return false;

	if (row > 3 || col > 3 || mtx > 7)
		return false;

	reg.num = 0;
	switch (mode)
	{
	case 'r':					// transposed vector
		reg.num |= (1 << 5);
		std::swap(col,row);
		[[fallthrough]];
	case 'c':					// vector	
		reg.type = MipsRegisterType::VfpuVector;

		switch (size)
		{
		case 1:	// pair
		case 3: // quad
			if (row & 1)
				return false;
			break;
		case 2:	// triple
			if (row & 2)
				return false;
			row <<= 1;
			break;
		default:
			return false;
		}
		break;
	case 's':					// single
		reg.type = MipsRegisterType::VfpuVector;

		if (size != 0)
			return false;
		break;
	case 'e':					// transposed matrix
		reg.num |= (1 << 5);
		[[fallthrough]];
	case 'm':					// matrix
		reg.type = MipsRegisterType::VfpuMatrix;

		// check size
		switch (size)
		{
		case 1:	// 2x2
		case 3:	// 4x4
			if (row & 1)
				return false;
			break;
		case 2:	// 3x3
			if (row & ~1)
				return false;
			row <<= 1;
			break;
		default:
			return false;
		}
		break;
	default:
		return false;
	}

	reg.num |= mtx << 2;
	reg.num |= col;
	reg.num |= row << 5;

	reg.name = identifier;
	parser.eatToken();
	return true;
}